

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_test.cpp
# Opt level: O2

void sign_verifycase::test_method<picnic_params_t_const&>(anon_enum_32 *param)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_wrap_stringstream<char> *pbVar2;
  context_frame context_frame_240;
  const_string local_2e0;
  const_string local_2d0;
  const_string local_2c0;
  const_string local_2b0;
  const_string local_2a0;
  anon_enum_32 *local_290;
  undefined1 local_288 [16];
  undefined8 uStack_278;
  char *pcStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  _Alloc_hider _Stack_110;
  size_type sStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  sign_verifycase t;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined ***local_50;
  char *local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined ***local_30;
  char *local_28;
  
  local_50 = &local_80;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_00182750;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_30 = &local_60;
  local_38 = 0;
  local_288._8_8_ = local_288._8_8_ & 0xffffffffffffff00;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_00182710;
  local_48 = "param";
  local_40 = &PTR__lazy_ostream_001826d0;
  local_28 = " = ";
  uStack_278 = &t;
  _t = &PTR__lazy_ostream_00182690;
  local_288._0_8_ = &PTR__lazy_ostream_00182650;
  pcStack_270 = "; ";
  local_290 = param;
  context_frame_240.m_frame_id =
       boost::unit_test::framework::add_context((lazy_ostream *)local_288,true);
  local_2a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  sStack_108 = 0;
  aStack_100._M_allocated_capacity = 0;
  aStack_100._8_8_ = 0;
  local_2a0.m_end = "";
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  _Stack_110._M_p = (pointer)0x0;
  local_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  local_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  local_248 = 0;
  uStack_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  local_288._0_8_ = (_func_int **)0x0;
  local_288._8_8_ = 0;
  uStack_278 = (sign_verifycase *)0x0;
  pcStack_270 = (char *)0x0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  std::operator<<((ostream *)local_288,'\"');
  std::operator<<((ostream *)local_288,"sign_verify");
  std::operator<<((ostream *)local_288,"\" fixture ctor");
  pbVar2 = (basic_wrap_stringstream<char> *)local_288;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_b0.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_b0.m_end = local_b0.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_2a0,0x18,&local_b0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_2b0.m_end = "";
  sStack_108 = 0;
  aStack_100._M_allocated_capacity = 0;
  aStack_100._8_8_ = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  _Stack_110._M_p = (pointer)0x0;
  local_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  local_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  local_248 = 0;
  uStack_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  local_288._0_8_ = (_func_int **)0x0;
  local_288._8_8_ = 0;
  uStack_278 = (sign_verifycase *)0x0;
  pcStack_270 = (char *)0x0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  std::operator<<((ostream *)local_288,'\"');
  std::operator<<((ostream *)local_288,"sign_verify");
  std::operator<<((ostream *)local_288,"\" fixture setup");
  pbVar2 = (basic_wrap_stringstream<char> *)local_288;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_c0.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_c0.m_end = local_c0.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_2b0,0x18,&local_c0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  local_2c0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_2c0.m_end = "";
  sStack_108 = 0;
  aStack_100._M_allocated_capacity = 0;
  aStack_100._8_8_ = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  _Stack_110._M_p = (pointer)0x0;
  local_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  local_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  local_248 = 0;
  uStack_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  local_288._0_8_ = (_func_int **)0x0;
  local_288._8_8_ = 0;
  uStack_278 = (sign_verifycase *)0x0;
  pcStack_270 = (char *)0x0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  std::operator<<((ostream *)local_288,'\"');
  std::operator<<((ostream *)local_288,"sign_verify");
  std::operator<<((ostream *)local_288,"\" test entry");
  pbVar2 = (basic_wrap_stringstream<char> *)local_288;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_d0.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_d0.m_end = local_d0.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_2c0,0x18,&local_d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  _impl<picnic_params_t>(&t,param);
  local_2d0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_2d0.m_end = "";
  sStack_108 = 0;
  aStack_100._M_allocated_capacity = 0;
  aStack_100._8_8_ = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  _Stack_110._M_p = (pointer)0x0;
  local_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  local_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  local_248 = 0;
  uStack_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  local_288._0_8_ = (_func_int **)0x0;
  local_288._8_8_ = 0;
  uStack_278 = (sign_verifycase *)0x0;
  pcStack_270 = (char *)0x0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  std::operator<<((ostream *)local_288,'\"');
  std::operator<<((ostream *)local_288,"sign_verify");
  std::operator<<((ostream *)local_288,"\" fixture teardown");
  pbVar2 = (basic_wrap_stringstream<char> *)local_288;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_e0.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_e0.m_end = local_e0.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_2d0,0x18,&local_e0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_2e0.m_end = "";
  sStack_108 = 0;
  aStack_100._M_allocated_capacity = 0;
  aStack_100._8_8_ = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  _Stack_110._M_p = (pointer)0x0;
  local_188 = 0;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  uStack_198 = 0;
  uStack_190 = 0;
  local_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  local_248 = 0;
  uStack_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  local_288._0_8_ = (_func_int **)0x0;
  local_288._8_8_ = 0;
  uStack_278 = (sign_verifycase *)0x0;
  pcStack_270 = (char *)0x0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  std::operator<<((ostream *)local_288,'\"');
  std::operator<<((ostream *)local_288,"sign_verify");
  std::operator<<((ostream *)local_288,"\" fixture dtor");
  pbVar2 = (basic_wrap_stringstream<char> *)local_288;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_f0.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_f0.m_end = local_f0.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_2e0,0x18,&local_f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_288);
  boost::test_tools::tt_detail::context_frame::~context_frame(&context_frame_240);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(sign_verify, all_supported_parameters(), param) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(param)) {
    const size_t max_signature_size = picnic_signature_size(param);
    BOOST_TEST(max_signature_size);

    std::array<uint8_t, 32> m;
    randomize_container(m);

    // Create a key pair
    picnic_privatekey_t private_key;
    picnic_publickey_t public_key;
    BOOST_TEST(!picnic_keygen(param, &public_key, &private_key));

    // Valid key pair
    BOOST_TEST(picnic_get_public_key_param(&public_key) == param);
    BOOST_TEST(picnic_get_private_key_param(&private_key) == param);
    BOOST_TEST(!picnic_validate_keypair(&private_key, &public_key));

    std::vector<uint8_t> sig;
    sig.resize(max_signature_size);
    size_t siglen = max_signature_size;

    // Sign a message
    BOOST_TEST(!picnic_sign(&private_key, m.data(), m.size(), sig.data(), &siglen));
    BOOST_TEST(siglen > 0);
    BOOST_TEST(siglen <= max_signature_size);
    // Verify signature
    BOOST_TEST(!picnic_verify(&public_key, m.data(), m.size(), sig.data(), siglen));
  }
}